

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

bool __thiscall
ViconCGStreamIO::VBuffer::Read<float>
          (VBuffer *this,vector<float,_std::allocator<float>_> *o_rValues)

{
  pointer pfVar1;
  bool bVar2;
  uint in_EAX;
  float *o_pValue;
  UInt32 Size;
  undefined8 uStack_18;
  
  pfVar1 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pfVar1) {
    (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  uStack_18 = (ulong)in_EAX;
  bVar2 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,(uint *)((long)&uStack_18 + 4));
  if (bVar2) {
    std::vector<float,_std::allocator<float>_>::resize(o_rValues,uStack_18 >> 0x20);
    pfVar1 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    o_pValue = (float *)0x0;
    if (pfVar1 != (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      o_pValue = pfVar1;
    }
    bVar2 = VBufferImpl::ReadPodArray<float>(&this->m_BufferImpl,o_pValue,uStack_18._4_4_);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }